

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall calculator::DivZeroException::~DivZeroException(DivZeroException *this)

{
  DivZeroException *this_local;
  
  ~DivZeroException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

DivZeroException(double x, int y) {
        error_msg = "Error: div zero/0 error: " + std::to_string(x) + "/" +
                    std::to_string(y);
    }